

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledInputFile.cpp
# Opt level: O2

void __thiscall Imf_2_5::anon_unknown_8::TileBufferTask::execute(TileBufferTask *this)

{
  pointer ppTVar1;
  pointer ppTVar2;
  TOutSliceInfo *pTVar3;
  long *plVar4;
  int iVar5;
  int iVar6;
  Data *pDVar7;
  ulong uVar8;
  Compression *pCVar9;
  Compressor *pCVar10;
  int yOffsetForSampleCount;
  size_t i_1;
  int y;
  int iVar11;
  long lVar12;
  size_t i;
  long lVar13;
  TileBuffer *pTVar14;
  int yOffsetForData;
  int iVar15;
  ulong uVar16;
  uint uVar17;
  Box2i tileRange;
  char *writePtr;
  vector<unsigned_long,_std::allocator<unsigned_long>_> bytesPerLine;
  char *compPtr;
  char *writePtr_1;
  vector<int,_std::allocator<int>_> yOffsets;
  vector<int,_std::allocator<int>_> xOffsets;
  char *ptr;
  char *local_50;
  int local_48;
  int iStack_44;
  int iStack_40;
  int iStack_3c;
  
  pDVar7 = this->_ofd;
  pTVar14 = this->_tileBuffer;
  Imf_2_5::dataWindowForTile
            ((Imf_2_5 *)&tileRange,&pDVar7->tileDesc,pDVar7->minX,pDVar7->maxX,pDVar7->minY,
             pDVar7->maxY,*(int *)&pTVar14->_sem,*(int *)&pTVar14->field_0x5c,
             *(int *)&pTVar14->field_0x60,*(int *)&pTVar14->field_0x64);
  iVar5 = tileRange.max.y - tileRange.min.y;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&bytesPerLine,(ulong)(this->_ofd->tileDesc).ySize,(allocator_type *)&xOffsets);
  std::vector<int,_std::allocator<int>_>::vector
            (&xOffsets,
             (long)(this->_ofd->slices).
                   super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->_ofd->slices).
                   super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3,(allocator_type *)&yOffsets);
  std::vector<int,_std::allocator<int>_>::vector
            (&yOffsets,
             (long)(this->_ofd->slices).
                   super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->_ofd->slices).
                   super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3,(allocator_type *)&writePtr_1);
  pDVar7 = this->_ofd;
  ppTVar1 = (pDVar7->slices).
            super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppTVar2 = (pDVar7->slices).
            super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (lVar13 = 0; (long)ppTVar2 - (long)ppTVar1 >> 3 != lVar13; lVar13 = lVar13 + 1) {
    pTVar3 = ppTVar1[lVar13];
    xOffsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [lVar13] = tileRange.min.x * pTVar3->xTileCoords;
    yOffsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [lVar13] = tileRange.min.y * pTVar3->yTileCoords;
  }
  calculateBytesPerLine
            (&pDVar7->header,pDVar7->sampleCountSliceBase,pDVar7->sampleCountXStride,
             pDVar7->sampleCountYStride,tileRange.min.x,tileRange.max.x,tileRange.min.y,
             tileRange.max.y,&xOffsets,&yOffsets,&bytesPerLine);
  uVar16 = 0;
  lVar12 = 0;
  for (lVar13 = 0;
      (long)bytesPerLine.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)bytesPerLine.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start >> 3 != lVar13; lVar13 = lVar13 + 1) {
    uVar8 = bytesPerLine.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[lVar13];
    lVar12 = lVar12 + uVar8;
    if (uVar16 < uVar8) {
      uVar16 = uVar8;
    }
  }
  Array<char>::resizeErase((Array<char> *)this->_tileBuffer,lVar12);
  writePtr = this->_tileBuffer->buffer;
  pDVar7 = this->_ofd;
  iVar6 = pDVar7->sampleCountXTileCoords;
  if (pDVar7->sampleCountXTileCoords != 0) {
    iVar6 = tileRange.min.x;
  }
  yOffsetForSampleCount = pDVar7->sampleCountYTileCoords;
  if (pDVar7->sampleCountYTileCoords != 0) {
    yOffsetForSampleCount = tileRange.min.y;
  }
  for (iVar11 = tileRange.min.y; iVar11 <= tileRange.max.y; iVar11 = iVar11 + 1) {
    uVar17 = 0;
    while( true ) {
      ppTVar1 = (pDVar7->slices).
                super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(pDVar7->slices).
                        super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar1 >> 3) <=
          (ulong)uVar17) break;
      pTVar3 = ppTVar1[uVar17];
      if (pTVar3->zero == true) {
        fillChannelWithZeroes
                  (&writePtr,pDVar7->format,pTVar3->type,
                   bytesPerLine.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start[(long)iVar11 - (long)tileRange.min.y]);
      }
      else {
        iVar15 = pTVar3->xTileCoords;
        if (pTVar3->xTileCoords != 0) {
          iVar15 = tileRange.min.x;
        }
        yOffsetForData = pTVar3->yTileCoords;
        if (pTVar3->yTileCoords != 0) {
          yOffsetForData = tileRange.min.y;
        }
        copyFromDeepFrameBuffer
                  (&writePtr,pTVar3->base,pDVar7->sampleCountSliceBase,
                   (long)pDVar7->sampleCountXStride,(long)pDVar7->sampleCountYStride,iVar11,
                   tileRange.min.x,tileRange.max.x,iVar6,yOffsetForSampleCount,iVar15,yOffsetForData
                   ,pTVar3->sampleStride,pTVar3->xStride,pTVar3->yStride,pDVar7->format,pTVar3->type
                  );
      }
      uVar17 = uVar17 + 1;
      pDVar7 = this->_ofd;
    }
  }
  ptr = (this->_tileBuffer->exception)._M_dataplus._M_p;
  iVar11 = 0;
  for (lVar13 = (long)tileRange.min.y; lVar13 <= tileRange.max.y; lVar13 = lVar13 + 1) {
    iVar15 = 0;
    for (lVar12 = (long)tileRange.min.x; lVar12 <= tileRange.max.x; lVar12 = lVar12 + 1) {
      pDVar7 = this->_ofd;
      iVar15 = iVar15 + *(int *)(pDVar7->sampleCountSliceBase +
                                (long)pDVar7->sampleCountXStride * (lVar12 - iVar6) +
                                (long)pDVar7->sampleCountYStride * (lVar13 - yOffsetForSampleCount))
      ;
      Xdr::write<Imf_2_5::CharPtrIO,char*>(&ptr,iVar15);
      iVar11 = iVar11 + 4;
    }
  }
  pTVar14 = this->_tileBuffer;
  plVar4 = *(long **)((long)&(pTVar14->exception).field_2 + 8);
  if (plVar4 == (long *)0x0) {
    pDVar7 = this->_ofd;
LAB_001daba0:
    uVar8 = pDVar7->maxSampleCountTableSize;
  }
  else {
    iVar6 = (**(code **)(*plVar4 + 0x20))
                      (plVar4,(pTVar14->exception)._M_dataplus._M_p,iVar11,tileRange.min.y,
                       &(pTVar14->exception)._M_string_length);
    pTVar14 = this->_tileBuffer;
    *(long *)&(pTVar14->exception).field_2 = (long)iVar6;
    pDVar7 = this->_ofd;
    if (*(long *)((long)&(pTVar14->exception).field_2 + 8) == 0) goto LAB_001daba0;
    uVar8 = pDVar7->maxSampleCountTableSize;
    if ((pTVar14->exception).field_2._M_allocated_capacity < uVar8) goto LAB_001dabb3;
  }
  (pTVar14->exception).field_2._M_allocated_capacity = uVar8;
  (pTVar14->exception)._M_string_length = (size_type)(pTVar14->exception)._M_dataplus._M_p;
LAB_001dabb3:
  plVar4 = *(long **)&pTVar14->dy;
  pTVar14->compressor = (Compressor *)(writePtr + -(long)pTVar14->buffer);
  *(Compressor **)&pTVar14->format = (Compressor *)(writePtr + -(long)pTVar14->buffer);
  *(char **)&pTVar14->dataSize = pTVar14->buffer;
  if (plVar4 != (long *)0x0) {
    (**(code **)(*plVar4 + 8))(plVar4);
    pDVar7 = this->_ofd;
  }
  pCVar9 = Header::compression(&pDVar7->header);
  pCVar10 = newTileCompressor(*pCVar9,uVar16,(ulong)(this->_ofd->tileDesc).ySize,&this->_ofd->header
                             );
  pTVar14 = this->_tileBuffer;
  *(Compressor **)&pTVar14->dy = pCVar10;
  if (pCVar10 != (Compressor *)0x0) {
    local_48 = tileRange.min.x;
    iStack_44 = tileRange.min.y;
    iStack_40 = tileRange.max.x;
    iStack_3c = tileRange.max.y;
    iVar6 = (*pCVar10->_vptr_Compressor[5])
                      (pCVar10,*(undefined8 *)&pTVar14->dataSize,
                       (ulong)*(uint *)&pTVar14->compressor,&local_48,&compPtr);
    pTVar14 = this->_tileBuffer;
    if ((Compressor *)(long)iVar6 < pTVar14->compressor) {
      pTVar14->compressor = (Compressor *)(long)iVar6;
      *(char **)&pTVar14->dataSize = compPtr;
    }
    else {
      pDVar7 = this->_ofd;
      if (pDVar7->format == NATIVE) {
        writePtr_1 = pTVar14->buffer;
        iVar6 = -1;
        if (-1 < iVar5) {
          iVar6 = iVar5;
        }
        local_50 = writePtr_1;
        for (uVar16 = 0; uVar16 != iVar6 + 1; uVar16 = uVar16 + 1) {
          uVar17 = 0;
          while( true ) {
            ppTVar1 = (pDVar7->slices).
                      super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if ((ulong)((long)(pDVar7->slices).
                              super__Vector_base<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar1 >> 3) <=
                (ulong)uVar17) break;
            convertInPlace(&writePtr_1,&local_50,ppTVar1[uVar17]->type,
                           bytesPerLine.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start[uVar16]);
            uVar17 = uVar17 + 1;
          }
        }
      }
    }
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&yOffsets.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&xOffsets.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&bytesPerLine.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return;
}

Assistant:

void
TileBufferTask::execute ()
{
    try
    {
        //
        // Calculate information about the tile
        //
    
        Box2i tileRange =  OPENEXR_IMF_INTERNAL_NAMESPACE::dataWindowForTile (
                _ifd->tileDesc,
                _ifd->minX, _ifd->maxX,
                _ifd->minY, _ifd->maxY,
                _tileBuffer->dx,
                _tileBuffer->dy,
                _tileBuffer->lx,
                _tileBuffer->ly);

        int numPixelsPerScanLine = tileRange.max.x - tileRange.min.x + 1;
    
        int numPixelsInTile = numPixelsPerScanLine *
                            (tileRange.max.y - tileRange.min.y + 1);
    
        int sizeOfTile = _ifd->bytesPerPixel * numPixelsInTile;
    
    
        //
        // Uncompress the data, if necessary
        //
    
        if (_tileBuffer->compressor && _tileBuffer->dataSize < sizeOfTile)
        {
            _tileBuffer->format = _tileBuffer->compressor->format();

            _tileBuffer->dataSize = _tileBuffer->compressor->uncompressTile
		(_tileBuffer->buffer, _tileBuffer->dataSize,
		 tileRange, _tileBuffer->uncompressedData);
        }
        else
        {
            //
            // If the line is uncompressed, it's in XDR format,
            // regardless of the compressor's output format.
            //
    
            _tileBuffer->format = Compressor::XDR;
            _tileBuffer->uncompressedData = _tileBuffer->buffer;
        }
    
        //
        // Convert the tile of pixel data back from the machine-independent
	// representation, and store the result in the frame buffer.
        //
    
        const char *readPtr = _tileBuffer->uncompressedData;
                                                        // points to where we
                                                        // read from in the
                                                        // tile block
        
        //
        // Iterate over the scan lines in the tile.
        //
    
        for (int y = tileRange.min.y; y <= tileRange.max.y; ++y)
        {
            //
            // Iterate over all image channels.
            //
            
            for (unsigned int i = 0; i < _ifd->slices.size(); ++i)
            {
                const TInSliceInfo &slice = _ifd->slices[i];
    
                //
                // These offsets are used to facilitate both
                // absolute and tile-relative pixel coordinates.
                //
            
                int xOffset = slice.xTileCoords * tileRange.min.x;
                int yOffset = slice.yTileCoords * tileRange.min.y;
    
                //
                // Fill the frame buffer with pixel data.
                //
    
                if (slice.skip)
                {
                    //
                    // The file contains data for this channel, but
                    // the frame buffer contains no slice for this channel.
                    //
    
                    skipChannel (readPtr, slice.typeInFile,
                                 numPixelsPerScanLine);
                }
                else
                {
                    //
                    // The frame buffer contains a slice for this channel.
                    //
    
                    char *writePtr = slice.base +
                                     (y - yOffset) * slice.yStride +
                                     (tileRange.min.x - xOffset) *
                                     slice.xStride;

                    char *endPtr = writePtr +
                                   (numPixelsPerScanLine - 1) * slice.xStride;
                                    
                    copyIntoFrameBuffer (readPtr, writePtr, endPtr,
                                         slice.xStride,
                                         slice.fill, slice.fillValue,
                                         _tileBuffer->format,
                                         slice.typeInFrameBuffer,
                                         slice.typeInFile);
                }
            }
        }
    }
    catch (std::exception &e)
    {
        if (!_tileBuffer->hasException)
        {
            _tileBuffer->exception = e.what ();
            _tileBuffer->hasException = true;
        }
    }
    catch (...)
    {
        if (!_tileBuffer->hasException)
        {
            _tileBuffer->exception = "unrecognized exception";
            _tileBuffer->hasException = true;
        }
    }
}